

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O1

callback_t *
initial_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QTextStream *this;
  char cVar1;
  code *pcVar2;
  QByteArrayView QVar3;
  QTextStream *local_58;
  QString local_50;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  undefined8 local_20;
  
  clear_empty(f);
  cVar1 = std::istream::peek();
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_38 = 2;
    local_34 = 0;
    uStack_2c = 0;
    local_24 = 0;
    local_20 = parser()::category._8_8_;
    QMessageLogger::debug();
    this = local_58;
    QVar3.m_data = (storage_type *)0x7;
    QVar3.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(this,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_58[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_58,' ');
    }
    QTextStream::operator<<(local_58,cVar1);
    if (local_58[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_58,' ');
    }
    QDebug::~QDebug((QDebug *)&local_58);
  }
  if (cVar1 < '/') {
    if (cVar1 == -1) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      return __return_storage_ptr__;
    }
    if (cVar1 == '#') {
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      pcVar2 = state_include;
      goto LAB_001058c5;
    }
  }
  else {
    if (cVar1 == '/') {
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      pcVar2 = guess_documentation_state;
      goto LAB_001058c5;
    }
    if (cVar1 == '{') {
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      pcVar2 = begin_class_state;
      goto LAB_001058c5;
    }
  }
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  pcVar2 = multi_purpose_string_state;
LAB_001058c5:
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  return __return_storage_ptr__;
}

Assistant:

callback_t initial_state(MetaConfiguration &conf, std::ifstream &f,
                         int &error) {
  clear_empty(f);

  char c = f.peek();
  qCDebug(parser) << "Peeking" << c;
  switch (c) {
  case '#':
    return state_include;
  case '{':
    return begin_class_state;
  // case '[' : return begin_array_state;
  case '/':
    return guess_documentation_state;
  case EOF:
    return nullptr;
  default:
    return multi_purpose_string_state;
  }
  return nullptr;
}